

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O1

void printOperand(MCInst *MI,int OpNum,SStream *O)

{
  anon_union_1480_8_3a70395c_for_cs_detail_6 *paVar1;
  uint8_t *puVar2;
  byte bVar3;
  cs_detail *pcVar4;
  _Bool _Var5;
  uint uVar6;
  MCOperand *op;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  
  if ((int)(uint)MI->size <= OpNum) {
    return;
  }
  op = MCInst_getOperand(MI,OpNum);
  _Var5 = MCOperand_isReg(op);
  if (_Var5) {
    uVar6 = MCOperand_getReg(op);
    SStream_concat0(O,getRegisterName_AsmStrs +
                      *(uint *)(getRegisterName_RegAsmOffset + (ulong)(uVar6 - 1) * 4));
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar4 = MI->flat_insn->detail;
    bVar3 = (pcVar4->field_6).x86.prefix[0];
    if (MI->csh->doing_mem == true) {
      lVar8 = (ulong)bVar3 * 0x10;
      if (pcVar4->groups[lVar8 + 0x16] != '\0') {
        pcVar4->groups[lVar8 + 0x17] = (uint8_t)uVar6;
        return;
      }
      pcVar4->groups[lVar8 + 0x16] = (uint8_t)uVar6;
      return;
    }
    puVar2 = pcVar4->groups + (ulong)bVar3 * 0x10 + 0x12;
    puVar2[0] = '\x01';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
  }
  else {
    _Var5 = MCOperand_isImm(op);
    if (!_Var5) {
      return;
    }
    uVar7 = MCOperand_getImm(op);
    uVar6 = (uint)uVar7;
    if ((int)uVar6 < 0) {
      uVar7 = (ulong)-uVar6;
      if ((int)uVar6 < -9) {
        pcVar9 = "-0x%x";
      }
      else {
        pcVar9 = "-%u";
      }
    }
    else {
      if ((int)uVar6 < 10) {
        pcVar9 = ", %u";
      }
      else {
        pcVar9 = ", 0x%x";
      }
      pcVar9 = pcVar9 + 2;
      uVar7 = uVar7 & 0xffffffff;
    }
    SStream_concat(O,pcVar9,uVar7);
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar4 = MI->flat_insn->detail;
    bVar3 = (pcVar4->field_6).x86.prefix[0];
    if (MI->csh->doing_mem == true) {
      *(uint *)(pcVar4->groups + (ulong)bVar3 * 0x10 + 0x1a) = uVar6;
      return;
    }
    puVar2 = pcVar4->groups + (ulong)bVar3 * 0x10 + 0x12;
    puVar2[0] = '\x02';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
  }
  pcVar4 = MI->flat_insn->detail;
  *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.prefix[0] * 0x10 + 0x16) = uVar6;
  paVar1 = &MI->flat_insn->detail->field_6;
  (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
  return;
}

Assistant:

static void _printOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op  = MCInst_getOperand(MI, OpNo);
	if (MCOperand_isReg(Op)) {
		printRegName(O, MCOperand_getReg(Op));
	} else if (MCOperand_isImm(Op)) {
		int64_t imm = MCOperand_getImm(Op);
		if (imm < 0) {
			if (imm < -HEX_THRESHOLD)
				SStream_concat(O, "-0x%"PRIx64, -imm);
			else
				SStream_concat(O, "-%"PRIu64, -imm);

		} else {
			if (imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%"PRIx64, imm);
			else
				SStream_concat(O, "%"PRIu64, imm);
		}
	}
}